

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Property.cpp
# Opt level: O0

bool Shell::Property::hasXEqualsY(Clause *c)

{
  Term *this;
  bool bVar1;
  uint uVar2;
  uint uVar3;
  Literal **ppLVar4;
  TermList *this_00;
  Clause *in_RDI;
  TermList *ts2;
  TermList *ts1;
  Literal *lit;
  int i;
  TermList *in_stack_ffffffffffffffd0;
  uint local_14;
  
  local_14 = Kernel::Clause::length(in_RDI);
  do {
    do {
      do {
        do {
          local_14 = local_14 - 1;
          if ((int)local_14 < 0) {
            return false;
          }
          ppLVar4 = Kernel::Clause::operator[](in_RDI,local_14);
          this = &(*ppLVar4)->super_Term;
          bVar1 = Kernel::Literal::isNegative((Literal *)0xce6655);
        } while ((bVar1) || (bVar1 = Kernel::Literal::isEquality((Literal *)0xce6667), !bVar1));
        this_00 = Kernel::Term::args(this);
        bVar1 = Kernel::TermList::isVar(in_stack_ffffffffffffffd0);
      } while (!bVar1);
      in_stack_ffffffffffffffd0 = Kernel::TermList::next(this_00);
      bVar1 = Kernel::TermList::isVar(in_stack_ffffffffffffffd0);
    } while (!bVar1);
    uVar2 = Kernel::TermList::var(this_00);
    uVar3 = Kernel::TermList::var(in_stack_ffffffffffffffd0);
  } while (uVar2 == uVar3);
  return true;
}

Assistant:

bool Property::hasXEqualsY(const Clause* c)
{
  for (int i = c->length()-1; i >= 0; i--) {
    const Literal* lit = (*c)[i];
    if (lit->isNegative()) {
      continue;
    }
    if (!lit->isEquality()) {
      continue;
    }
    const TermList* ts1 = lit->args();
    if (!ts1->isVar()) {
      continue;
    }
    const TermList* ts2 = ts1->next();
    if (ts2->isVar() &&
	ts1->var() != ts2->var()) {
      return true;
    }
  }
  return  false;
}